

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestDeprecatedFields::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  char *failure_msg;
  void *pvVar4;
  int iVar5;
  Arena *arena;
  TestDeprecatedFields *_this;
  TestDeprecatedFields *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestDeprecatedFields *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestDeprecatedFields_const*,edition_unittest::TestDeprecatedFields*>
                          ((TestDeprecatedFields **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    iVar5 = 0x2d17;
LAB_009b6931:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,iVar5,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.deprecated_repeated_string_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[1]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.deprecated_message_ != nullptr";
        iVar5 = 0x2d1f;
        goto LAB_009b6931;
      }
      pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar4 = google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>(arena,pMVar2);
        *(void **)((long)&local_30->field_0 + 0x20) = pvVar4;
      }
      else {
        edition_unittest::TestAllTypes_NestedMessage::MergeImpl(pMVar3,pMVar2);
      }
    }
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.nested_ != nullptr";
        iVar5 = 0x2d27;
        goto LAB_009b6931;
      }
      pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x28);
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar4 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestDeprecatedFields>
                           (arena,pMVar2);
        *(void **)((long)&local_30->field_0 + 0x28) = pvVar4;
      }
      else {
        MergeImpl(pMVar3,pMVar2);
      }
    }
    if ((uVar1 & 4) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  iVar5 = (int)from_msg[4]._internal_metadata_.ptr_;
  if (iVar5 != 0) {
    if (*(int *)((long)&local_30->field_0 + 0x38) != iVar5) {
      *(int *)((long)&local_30->field_0 + 0x38) = iVar5;
    }
    if (iVar5 == 2) {
      (local_30->field_0)._impl_.oneof_fields_ =
           *(OneofFieldsUnion *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestDeprecatedFields::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDeprecatedFields*>(&to_msg);
  auto& from = static_cast<const TestDeprecatedFields&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestDeprecatedFields)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_deprecated_repeated_string()->MergeFrom(from._internal_deprecated_repeated_string());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.deprecated_message_ != nullptr);
      if (_this->_impl_.deprecated_message_ == nullptr) {
        _this->_impl_.deprecated_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.deprecated_message_);
      } else {
        _this->_impl_.deprecated_message_->MergeFrom(*from._impl_.deprecated_message_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_ != nullptr);
      if (_this->_impl_.nested_ == nullptr) {
        _this->_impl_.nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_);
      } else {
        _this->_impl_.nested_->MergeFrom(*from._impl_.nested_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_int32_ = from._impl_.deprecated_int32_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_fields();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kDeprecatedInt32InOneof: {
        _this->_impl_.oneof_fields_.deprecated_int32_in_oneof_ = from._impl_.oneof_fields_.deprecated_int32_in_oneof_;
        break;
      }
      case ONEOF_FIELDS_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}